

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O2

void __thiscall TApp_BadSubcomSearch_Test::TestBody(TApp_BadSubcomSearch_Test *this)

{
  bool bVar1;
  App *pAVar2;
  App *this_00;
  AssertHelper AStack_a8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"one",(allocator *)&local_a0);
  std::__cxx11::string::string((string *)&local_58,"",(allocator *)&AStack_a8);
  this_00 = &(this->super_TApp).app;
  pAVar2 = CLI::App::add_subcommand(this_00,&local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::string((string *)&local_78,"two",(allocator *)&local_a0);
  std::__cxx11::string::string((string *)&local_98,"",(allocator *)&AStack_a8);
  pAVar2 = CLI::App::add_subcommand(pAVar2,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    CLI::App::get_subcommand(this_00,pAVar2);
  }
  testing::Message::Message((Message *)&local_a0);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/SubcommandTest.cpp"
             ,0x18b,
             "Expected: app.get_subcommand(two) throws an exception of type CLI::OptionNotFound.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
  testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_a0);
  return;
}

Assistant:

TEST_F(TApp, BadSubcomSearch) {

    auto one = app.add_subcommand("one");
    auto two = one->add_subcommand("two");

    EXPECT_THROW(app.get_subcommand(two), CLI::OptionNotFound);
}